

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O2

void t7(void)

{
  int iVar1;
  
  puts("Watchdog tests.");
  callback(0x19,1,t7cbf);
  set_watchdog(0x19,0x32);
  time_sleep(0x3fe0000000000000);
  iVar1 = t7_count;
  time_sleep(0x4000000000000000);
  CHECK(7,1,t7_count - iVar1,0x27,5,"set watchdog on count");
  set_watchdog(0x19,0);
  time_sleep(0x3fe0000000000000);
  iVar1 = t7_count;
  time_sleep(0x4000000000000000);
  CHECK(7,2,t7_count - iVar1,0,1,"set watchdog off count");
  return;
}

Assistant:

void t7()
{
   int c, oc;

   printf("Watchdog tests.\n");

   /* type of edge shouldn't matter for watchdogs */
   callback(GPIO, FALLING_EDGE, t7cbf);

   set_watchdog(GPIO, 50); /* 50 ms, 20 per second */
   time_sleep(0.5);
   oc = t7_count;
   time_sleep(2);
   c = t7_count - oc;
   CHECK(7, 1, c, 39, 5, "set watchdog on count");

   set_watchdog(GPIO, 0); /* 0 switches watchdog off */
   time_sleep(0.5);
   oc = t7_count;
   time_sleep(2);
   c = t7_count - oc;
   CHECK(7, 2, c, 0, 1, "set watchdog off count");
}